

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_line_element.hpp
# Opt level: O0

void __thiscall TextLineElement::~TextLineElement(TextLineElement *this)

{
  TextLineElement *this_local;
  
  LineElement::~LineElement(&this->super_LineElement);
  return;
}

Assistant:

~TextLineElement() {}